

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Json::Json(Json *this,object *values)

{
  _Base_ptr local_18;
  object *values_local;
  Json *this_local;
  
  local_18 = (_Base_ptr)values;
  values_local = (object *)this;
  std::
  make_shared<json11::JsonObject,std::map<std::__cxx11::string,json11::Json,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json11::Json>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
              *)&stack0xffffffffffffffd8);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonObject,void>
            (&this->m_ptr,(shared_ptr<json11::JsonObject> *)&stack0xffffffffffffffd8);
  std::shared_ptr<json11::JsonObject>::~shared_ptr
            ((shared_ptr<json11::JsonObject> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

Json::Json(Json::object &&values)      : m_ptr(make_shared<JsonObject>(move(values))) {}